

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ITransientExpression::~ITransientExpression(ITransientExpression *this)

{
  code *pcVar1;
  ITransientExpression *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void formatReconstructedExpression(std::ostream &os, std::string const &lhs, StringRef op, std::string const &rhs) {
    if (lhs.size() + rhs.size() < 40 && lhs.find('\n') == std::string::npos && rhs.find('\n') == std::string::npos)
      os << lhs << " " << op << " " << rhs;
    else
      os << lhs << "\n"
         << op << "\n"
         << rhs;
  }